

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O0

unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
 booster::locale::impl_posix::create_iconv_converter(string *encoding)

{
  _Head_base<0UL,_booster::locale::util::base_converter_*,_false> in_RDI;
  exception *e;
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  *cvt;
  string *in_stack_00000098;
  mb2_iconv_converter *in_stack_000000a0;
  _Head_base<0UL,_booster::locale::util::base_converter_*,_false> this;
  
  this._M_head_impl = in_RDI._M_head_impl;
  std::
  unique_ptr<booster::locale::util::base_converter,std::default_delete<booster::locale::util::base_converter>>
  ::unique_ptr<std::default_delete<booster::locale::util::base_converter>,void>
            ((unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
              *)in_RDI._M_head_impl);
  operator_new(0x48);
  mb2_iconv_converter::mb2_iconv_converter(in_stack_000000a0,in_stack_00000098);
  std::
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  ::reset((unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
           *)this._M_head_impl,in_RDI._M_head_impl);
  return (__uniq_ptr_data<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>,_true,_true>
          )(tuple<booster::locale::util::base_converter_*,_std::default_delete<booster::locale::util::base_converter>_>
            )this._M_head_impl;
}

Assistant:

std::unique_ptr<util::base_converter> create_iconv_converter(std::string const &encoding)
    {
        std::unique_ptr<util::base_converter> cvt;
        try {
            cvt.reset(new mb2_iconv_converter(encoding));
        }
        catch(std::exception const &e) {
            // Nothing to do, just retrun empty cvt
        }
        return cvt;
    }